

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void single_channel_8_to_rgb_888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  undefined2 *puVar1;
  undefined1 uVar2;
  undefined2 *puVar3;
  undefined1 *puVar4;
  int iVar5;
  
  if (0 < height) {
    puVar3 = (undefined2 *)((long)dst + (long)(dy * dst_pitch) + (long)(dx * 3));
    puVar4 = (undefined1 *)((long)src + (long)(sy * src_pitch) + (long)sx);
    iVar5 = 0;
    do {
      if (0 < width) {
        puVar1 = (undefined2 *)((long)puVar3 + (long)(width * 3));
        do {
          uVar2 = *puVar4;
          *puVar3 = 0;
          *(undefined1 *)(puVar3 + 1) = uVar2;
          puVar4 = puVar4 + 1;
          puVar3 = (undefined2 *)((long)puVar3 + 3);
        } while (puVar3 < puVar1);
      }
      puVar3 = (undefined2 *)((long)puVar3 + (long)(dst_pitch + width * -3));
      puVar4 = puVar4 + (src_pitch - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void single_channel_8_to_rgb_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_RGB_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}